

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

void UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  UChar *pUVar1;
  byte bVar2;
  char cVar3;
  byte *sourceLimit;
  void *pvVar4;
  int32_t *piVar5;
  UChar UVar6;
  uint uVar7;
  int8_t iVar8;
  int32_t length;
  int iVar9;
  UConverter *pUVar10;
  UConverterSharedData *sharedData;
  int iVar11;
  byte *pbVar12;
  UChar *pUVar13;
  uint uVar14;
  ulong uStack_60;
  byte *local_58;
  UErrorCode *local_50;
  byte local_43;
  byte local_42;
  byte local_41;
  ulong local_40;
  undefined4 *local_38;
  
  pbVar12 = (byte *)args->source;
  pUVar13 = args->target;
  pUVar10 = args->converter;
  sourceLimit = (byte *)args->sourceLimit;
  pvVar4 = pUVar10->extraInfo;
  local_38 = (undefined4 *)((long)pvVar4 + 0x5c);
  if (*(int *)((long)pvVar4 + 0x68) == 0) {
    local_58 = pbVar12;
    local_50 = err;
    if (sourceLimit <= pbVar12 || pUVar10->toULength != '\x01') goto LAB_002f58b9;
    if (args->targetLimit <= pUVar13) goto LAB_002f58b9;
    uStack_60 = (ulong)pUVar10->toUBytes[0];
    pUVar10->toULength = '\0';
    goto LAB_002f59b9;
  }
  do {
    local_40 = CONCAT71(local_40._1_7_,pUVar10->toULength);
    local_58 = pbVar12;
    changeState_2022(pUVar10,(char **)&local_58,(char *)sourceLimit,ISO_2022_CN,err);
    if (*(int *)((long)pvVar4 + 0x68) == 0) {
      if (U_ZERO_ERROR < *err) goto LAB_002f5881;
      if (*(char *)((long)pvVar4 + 0x70) != '\0') {
        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
        pUVar10 = args->converter;
        pUVar10->toUCallbackReason = UCNV_IRREGULAR;
        pUVar10->toULength = (char)local_40 + ((char)local_58 - (char)pbVar12);
        goto LAB_002f5881;
      }
    }
    local_50 = err;
    if (U_ZERO_ERROR < *err) {
LAB_002f5881:
      args->target = pUVar13;
      args->source = (char *)local_58;
      *(undefined1 *)((long)pvVar4 + 0x70) = 0;
      return;
    }
LAB_002f58b9:
    pbVar12 = local_58;
    if (sourceLimit <= pbVar12) goto LAB_002f5947;
    if (args->targetLimit <= pUVar13) {
      *local_50 = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002f5947;
    }
    bVar2 = *pbVar12;
    uStack_60 = (ulong)bVar2;
    if (bVar2 - 10 < 6) {
      local_58 = pbVar12 + 1;
      switch((uint)bVar2) {
      default:
        pbVar12 = pbVar12 + 1;
        *(undefined2 *)(local_38 + 1) = 0;
        *local_38 = 0;
        *(undefined1 *)((long)pvVar4 + 0x70) = 0;
        uVar7 = (uint)bVar2;
        break;
      case 0xb:
      case 0xc:
        goto switchD_002f58ec_caseD_b;
      case 0xe:
        if (*(char *)((long)pvVar4 + 0x5d) != '\0') {
          *(undefined1 *)((long)pvVar4 + 0x60) = 1;
          *(undefined1 *)((long)pvVar4 + 0x70) = 1;
          goto LAB_002f58b9;
        }
        pbVar12 = pbVar12 + 1;
        *(undefined1 *)((long)pvVar4 + 0x70) = 0;
        uStack_60 = 0xe;
        uVar7 = 0xffff;
        break;
      case 0xf:
        goto switchD_002f58ec_caseD_f;
      }
LAB_002f5a6e:
      uVar14 = (uint)uStack_60;
      iVar11 = (int)pbVar12;
      local_58 = pbVar12;
      if (uVar7 < 0xfffe) {
        if (args->offsets != (int32_t *)0x0) {
          iVar9 = -1;
          if (0xff < uVar14) {
            iVar9 = -2;
          }
          *(int *)((long)args->offsets + ((long)pUVar13 - (long)args->target) * 2) =
               (iVar9 + iVar11) - *(int *)&args->source;
        }
        *pUVar13 = (UChar)uVar7;
        pUVar13 = pUVar13 + 1;
        goto LAB_002f58b9;
      }
      if (0xffff < uVar7) {
        *pUVar13 = (short)(uVar7 + 0x3ff0000 >> 10) + L'\xd800';
        piVar5 = args->offsets;
        if (piVar5 != (int32_t *)0x0) {
          iVar9 = -1;
          if (0xff < uVar14) {
            iVar9 = -2;
          }
          *(int *)((long)piVar5 + ((long)pUVar13 - (long)args->target) * 2) =
               (iVar9 + iVar11) - *(int *)&args->source;
        }
        pUVar1 = pUVar13 + 1;
        UVar6 = (UChar)uVar7 & 0x3ffU | 0xdc00;
        if (pUVar1 < args->targetLimit) {
          *pUVar1 = UVar6;
          if (piVar5 != (int32_t *)0x0) {
            iVar9 = -1;
            if (0xff < uVar14) {
              iVar9 = -2;
            }
            *(int *)((long)piVar5 + ((long)pUVar1 - (long)args->target) * 2) =
                 (iVar9 + iVar11) - *(int *)&args->source;
          }
          pUVar13 = pUVar13 + 2;
        }
        else {
          pUVar10 = args->converter;
          cVar3 = pUVar10->UCharErrorBufferLength;
          pUVar10->UCharErrorBufferLength = cVar3 + '\x01';
          pUVar10->UCharErrorBuffer[cVar3] = UVar6;
          pUVar13 = pUVar1;
        }
        goto LAB_002f58b9;
      }
      pUVar10 = args->converter;
      iVar8 = '\x01';
      if (0xff < uVar14) {
        pUVar10->toUBytes[1] = (uint8_t)uStack_60;
        uStack_60 = uStack_60 >> 8;
        iVar8 = '\x02';
      }
      pUVar10->toUBytes[0] = (uint8_t)uStack_60;
      pUVar10->toULength = iVar8;
      *local_50 = (uint)(uVar7 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
LAB_002f5947:
      args->target = pUVar13;
      goto LAB_002f594b;
    }
    if (bVar2 != 0x1b) {
switchD_002f58ec_caseD_b:
      pbVar12 = pbVar12 + 1;
      *(undefined1 *)((long)pvVar4 + 0x70) = 0;
      if (*(char *)((long)pvVar4 + 0x60) == '\0') {
        uVar7 = 0xffff;
        if (-1 < (char)bVar2) {
          uVar7 = (uint)bVar2;
        }
      }
      else {
        if (sourceLimit <= pbVar12) {
          args->converter->toUBytes[0] = bVar2;
          args->converter->toULength = '\x01';
          goto LAB_002f5947;
        }
LAB_002f59b9:
        bVar2 = *pbVar12;
        iVar11 = (int)uStack_60;
        local_40 = (ulong)bVar2;
        if (((iVar11 + 0xdfU & 0xfe) < 0x5e) && ((byte)(bVar2 - 0x21) < 0x5e)) {
          pbVar12 = pbVar12 + 1;
          cVar3 = *(char *)((long)pvVar4 + (long)*(char *)((long)pvVar4 + 0x60) + 0x5c);
          if ((long)cVar3 < 0x20) {
            sharedData = *(UConverterSharedData **)((long)pvVar4 + (long)cVar3 * 8);
            length = 2;
            local_43 = (byte)uStack_60;
            local_42 = bVar2;
          }
          else {
            sharedData = *(UConverterSharedData **)((long)pvVar4 + 0x18);
            length = 3;
            local_43 = cVar3 + 0x60;
            local_41 = bVar2;
            local_42 = (byte)uStack_60;
          }
          local_58 = pbVar12;
          uVar7 = ucnv_MBCSSimpleGetNextUChar_63(sharedData,(char *)&local_43,length,'\0');
          uStack_60 = (ulong)(uint)(iVar11 * 0x100 + (int)local_40);
        }
        else {
          uVar7 = 0xffff;
          if ((0x5d < (byte)(bVar2 - 0x21)) &&
             ((0x1f < bVar2 || ((0x800c000U >> (bVar2 & 0x1f) & 1) == 0)))) {
            pbVar12 = pbVar12 + 1;
            uStack_60 = (ulong)(iVar11 * 0x100 + (uint)bVar2 + 0x10000);
          }
        }
        if ('\x01' < *(char *)((long)pvVar4 + 0x60)) {
          *(undefined1 *)((long)pvVar4 + 0x60) = *(undefined1 *)((long)pvVar4 + 0x61);
        }
      }
      goto LAB_002f5a6e;
    }
    pUVar10 = args->converter;
    err = local_50;
  } while( true );
switchD_002f58ec_caseD_f:
  *(undefined1 *)((long)pvVar4 + 0x60) = 0;
  if (*(char *)((long)pvVar4 + 0x70) != '\0') {
    *(undefined1 *)((long)pvVar4 + 0x70) = 0;
    *local_50 = U_ILLEGAL_ESCAPE_SEQUENCE;
    pUVar10 = args->converter;
    pUVar10->toUCallbackReason = UCNV_IRREGULAR;
    pUVar10->toUBytes[0] = '\x0f';
    args->converter->toULength = '\x01';
    args->target = pUVar13;
    pbVar12 = pbVar12 + 1;
LAB_002f594b:
    args->source = (char *)pbVar12;
    return;
  }
  goto LAB_002f58b9;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    char tempBuf[3];
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    uint32_t targetUniChar = 0x0000;
    uint32_t mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    ISO2022State *pToU2022State;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    pToU2022State = &myData->toU2022State;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        targetUniChar = missingCharMarker;
        goto getTrailByte;
    }

    while(mySource < mySourceLimit){

        targetUniChar =missingCharMarker;

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            switch(mySourceChar){
            case UCNV_SI:
                pToU2022State->g=0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = static_cast<uint8_t>(mySourceChar);
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;

            case UCNV_SO:
                if(pToU2022State->cs[1] != 0) {
                    pToU2022State->g=1;
                    myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                    continue;
                } else {
                    /* illegal to have SO before a matching designator */
                    myData->isEmptySegment = FALSE;	/* Handling a different error, reset this to avoid future spurious errs */
                    break;
                }

            case ESC_2022:
                mySource--;
escape:
                {
                    const char * mySourceBefore = mySource;
                    int8_t toULengthBefore = args->converter->toULength;

                    changeState_2022(args->converter,&(mySource),
                        mySourceLimit, ISO_2022_CN,err);

                    /* After SO there must be at least one character before a designator (designator error handled separately) */
                    if(myData->key==0 && U_SUCCESS(*err) && myData->isEmptySegment) {
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toULength = (int8_t)(toULengthBefore + (mySource - mySourceBefore));
                    }
                }

                /* invalid or illegal escape sequence */
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    myData->isEmptySegment = FALSE;	/* Reset to avoid future spurious errors */
                    return;
                }
                continue;

            /* ISO-2022-CN does not use single-byte (C1) SS2 and SS3 */

            case CR:
            case LF:
                uprv_memset(pToU2022State, 0, sizeof(ISO2022State));
                U_FALLTHROUGH;
            default:
                /* convert one or two bytes */
                myData->isEmptySegment = FALSE;
                if(pToU2022State->g != 0) {
                    if(mySource < mySourceLimit) {
                        UConverterSharedData *cnv;
                        StateEnum tempState;
                        int32_t tempBufLen;
                        int leadIsOk, trailIsOk;
                        uint8_t trailByte;
getTrailByte:
                        trailByte = (uint8_t)*mySource;
                        /*
                         * Ticket 5691: consistent illegal sequences:
                         * - We include at least the first byte in the illegal sequence.
                         * - If any of the non-initial bytes could be the start of a character,
                         *   we stop the illegal sequence before the first one of those.
                         *
                         * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                         * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                         * Otherwise we convert or report the pair of bytes.
                         */
                        leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                        trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                        if (leadIsOk && trailIsOk) {
                            ++mySource;
                            tempState = (StateEnum)pToU2022State->cs[pToU2022State->g];
                            if(tempState >= CNS_11643_0) {
                                cnv = myData->myConverterArray[CNS_11643];
                                tempBuf[0] = (char) (0x80+(tempState-CNS_11643_0));
                                tempBuf[1] = (char) (mySourceChar);
                                tempBuf[2] = (char) trailByte;
                                tempBufLen = 3;

                            }else{
                                U_ASSERT(tempState<UCNV_2022_MAX_CONVERTERS);
                                cnv = myData->myConverterArray[tempState];
                                tempBuf[0] = (char) (mySourceChar);
                                tempBuf[1] = (char) trailByte;
                                tempBufLen = 2;
                            }
                            targetUniChar = ucnv_MBCSSimpleGetNextUChar(cnv, tempBuf, tempBufLen, FALSE);
                            mySourceChar = (mySourceChar << 8) | trailByte;
                        } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                            /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                            ++mySource;
                            /* add another bit so that the code below writes 2 bytes in case of error */
                            mySourceChar = 0x10000 | (mySourceChar << 8) | trailByte;
                        }
                        if(pToU2022State->g>=2) {
                            /* return from a single-shift state to the previous one */
                            pToU2022State->g=pToU2022State->prevG;
                        }
                    } else {
                        args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                        args->converter->toULength = 1;
                        goto endloop;
                    }
                }
                else{
                    if(mySourceChar <= 0x7f) {
                        targetUniChar = (UChar) mySourceChar;
                    }
                }
                break;
            }
            if(targetUniChar < (missingCharMarker-1/*0xfffe*/)){
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else if(targetUniChar > missingCharMarker){
                /* disassemble the surrogate pair and write to output*/
                targetUniChar-=0x0010000;
                *myTarget = (UChar)(0xd800+(UChar)(targetUniChar>>10));
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                ++myTarget;
                if(myTarget< args->targetLimit){
                    *myTarget = (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                    if(args->offsets){
                        args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                    }
                    ++myTarget;
                }else{
                    args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]=
                                    (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                }

            }
            else{
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
endloop:
    args->target = myTarget;
    args->source = mySource;
}